

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MarkVarDeleted
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int var_index)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  this_00 = &this->is_var_deleted_;
  if ((ulong)(this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->is_var_deleted_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <=
      (ulong)(uint)var_index) {
    std::vector<bool,_std::allocator<bool>_>::reserve
              (this_00,(long)(this->vars_).
                             super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)(this->vars_).
                             super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<bool,_std::allocator<bool>_>::resize
              (this_00,(long)(int)((ulong)((long)(this->vars_).
                                                 super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->vars_).
                                                super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4),
               false);
  }
  uVar2 = (ulong)var_index;
  uVar3 = uVar2 + 0x3f;
  if (-1 < (long)uVar2) {
    uVar3 = uVar2;
  }
  puVar1 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)uVar3 >> 6) +
           (ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)var_index & 0x3f);
  return;
}

Assistant:

void MarkVarDeleted(int var_index) {
    if (is_var_deleted_.size() <= static_cast<unsigned>(var_index)) {
      is_var_deleted_.reserve(vars_.capacity());
      is_var_deleted_.resize(num_vars());
    }
    is_var_deleted_[var_index] = true;
  }